

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketExtensions.h
# Opt level: O0

void __thiscall
uWS::ExtensionsNegotiator<true>::readOffer(ExtensionsNegotiator<true> *this,string_view offer)

{
  uint *in_RDI;
  ExtensionsParser extensionsParser;
  size_t in_stack_ffffffffffffffd0;
  byte in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffd9;
  byte in_stack_ffffffffffffffda;
  undefined5 in_stack_ffffffffffffffdb;
  ExtensionsParser *in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::length(&local_10);
  ExtensionsParser::ExtensionsParser
            (in_stack_ffffffffffffffe0,
             (char *)CONCAT53(in_stack_ffffffffffffffdb,
                              CONCAT12(in_stack_ffffffffffffffda,
                                       CONCAT11(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8)
                                      )),in_stack_ffffffffffffffd0);
  if (((*in_RDI & 1) == 0) || ((in_stack_ffffffffffffffd8 & 1) == 0)) {
    *in_RDI = *in_RDI & 0xfffffffe;
  }
  else {
    if (((in_stack_ffffffffffffffda & 1) != 0) || ((*in_RDI & 4) != 0)) {
      *in_RDI = *in_RDI | 4;
    }
    if ((in_stack_ffffffffffffffd9 & 1) != 0) {
      *in_RDI = *in_RDI | 2;
    }
  }
  return;
}

Assistant:

void readOffer(std::string_view offer) {
        if (isServer) {
            ExtensionsParser extensionsParser(offer.data(), offer.length());
            if ((options & PERMESSAGE_DEFLATE) && extensionsParser.perMessageDeflate) {
                if (extensionsParser.clientNoContextTakeover || (options & CLIENT_NO_CONTEXT_TAKEOVER)) {
                    options |= CLIENT_NO_CONTEXT_TAKEOVER;
                }

                /* We leave this option for us to read even if the client did not send it */
                if (extensionsParser.serverNoContextTakeover) {
                    options |= SERVER_NO_CONTEXT_TAKEOVER;
                }/* else {
                    options &= ~SERVER_NO_CONTEXT_TAKEOVER;
                }*/
            } else {
                options &= ~PERMESSAGE_DEFLATE;
            }
        } else {
            // todo!
        }
    }